

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

extent_t * extent_heap_first(extent_heap_t *ph)

{
  extent_t *peVar1;
  void *pvVar2;
  void *pvVar3;
  extent_t *peVar4;
  extent_t *peVar5;
  extent_t **ppeVar6;
  extent_t *peVar7;
  extent_heap_t eVar8;
  extent_t *peVar9;
  int iVar10;
  extent_t *peVar11;
  ulong uVar12;
  ulong uVar13;
  
  peVar1 = ph->ph_root;
  if (peVar1 != (extent_t *)0x0) {
    eVar8.ph_root = (peVar1->ph_link).phn_next;
    if (eVar8.ph_root != (extent_t *)0x0) {
      (peVar1->ph_link).phn_prev = (extent_t *)0x0;
      (peVar1->ph_link).phn_next = (extent_t *)0x0;
      ((eVar8.ph_root)->ph_link).phn_prev = (extent_t *)0x0;
      peVar9 = ((eVar8.ph_root)->ph_link).phn_next;
      if (peVar9 != (extent_t *)0x0) {
        peVar11 = (peVar9->ph_link).phn_next;
        if (peVar11 != (extent_t *)0x0) {
          (peVar11->ph_link).phn_prev = (extent_t *)0x0;
        }
        ((eVar8.ph_root)->ph_link).phn_prev = (extent_t *)0x0;
        ((eVar8.ph_root)->ph_link).phn_next = (extent_t *)0x0;
        (peVar9->ph_link).phn_prev = (extent_t *)0x0;
        (peVar9->ph_link).phn_next = (extent_t *)0x0;
        uVar12 = (eVar8.ph_root)->e_bits >> 0x2a;
        uVar13 = peVar9->e_bits >> 0x2a;
        iVar10 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
        if (iVar10 == 0) {
          pvVar2 = (eVar8.ph_root)->e_addr;
          pvVar3 = peVar9->e_addr;
          iVar10 = (uint)(pvVar2 >= pvVar3 && pvVar2 != pvVar3) - (uint)(pvVar2 < pvVar3);
        }
        if (iVar10 < 0) {
          (peVar9->ph_link).phn_prev = eVar8.ph_root;
          peVar7 = ((eVar8.ph_root)->ph_link).phn_lchild;
          (peVar9->ph_link).phn_next = peVar7;
          if (peVar7 != (extent_t *)0x0) {
            (peVar7->ph_link).phn_prev = peVar9;
          }
          ((eVar8.ph_root)->ph_link).phn_lchild = peVar9;
          peVar9 = eVar8.ph_root;
        }
        else {
          ((eVar8.ph_root)->ph_link).phn_prev = peVar9;
          peVar7 = (peVar9->ph_link).phn_lchild;
          ((eVar8.ph_root)->ph_link).phn_next = peVar7;
          if (peVar7 != (extent_t *)0x0) {
            (peVar7->ph_link).phn_prev = eVar8.ph_root;
          }
          (peVar9->ph_link).phn_lchild = eVar8.ph_root;
          eVar8.ph_root = peVar9;
        }
        while (peVar7 = peVar11, peVar7 != (extent_t *)0x0) {
          peVar4 = (peVar7->ph_link).phn_next;
          if (peVar4 == (extent_t *)0x0) {
            peVar11 = (extent_t *)0x0;
          }
          else {
            peVar11 = (peVar4->ph_link).phn_next;
            if (peVar11 != (extent_t *)0x0) {
              (peVar11->ph_link).phn_prev = (extent_t *)0x0;
            }
            (peVar7->ph_link).phn_prev = (extent_t *)0x0;
            (peVar7->ph_link).phn_next = (extent_t *)0x0;
            (peVar4->ph_link).phn_prev = (extent_t *)0x0;
            (peVar4->ph_link).phn_next = (extent_t *)0x0;
            uVar13 = peVar7->e_bits >> 0x2a;
            uVar12 = peVar4->e_bits >> 0x2a;
            iVar10 = (uint)(uVar12 < uVar13) - (uint)(uVar13 < uVar12);
            if (iVar10 == 0) {
              pvVar2 = peVar7->e_addr;
              pvVar3 = peVar4->e_addr;
              iVar10 = (uint)(pvVar2 >= pvVar3 && pvVar2 != pvVar3) - (uint)(pvVar2 < pvVar3);
            }
            if (iVar10 < 0) {
              (peVar4->ph_link).phn_prev = peVar7;
              peVar5 = (peVar7->ph_link).phn_lchild;
              (peVar4->ph_link).phn_next = peVar5;
              if (peVar5 != (extent_t *)0x0) {
                (peVar5->ph_link).phn_prev = peVar4;
              }
              (peVar7->ph_link).phn_lchild = peVar4;
            }
            else {
              (peVar7->ph_link).phn_prev = peVar4;
              peVar5 = (peVar4->ph_link).phn_lchild;
              (peVar7->ph_link).phn_next = peVar5;
              if (peVar5 != (extent_t *)0x0) {
                (peVar5->ph_link).phn_prev = peVar7;
              }
              (peVar4->ph_link).phn_lchild = peVar7;
              peVar7 = peVar4;
            }
          }
          (peVar9->ph_link).phn_next = peVar7;
          peVar9 = peVar7;
        }
        peVar11 = ((eVar8.ph_root)->ph_link).phn_next;
        peVar7 = eVar8.ph_root;
        if (peVar11 != (extent_t *)0x0) {
          while( true ) {
            peVar4 = (peVar11->ph_link).phn_next;
            (peVar7->ph_link).phn_next = (extent_t *)0x0;
            (peVar11->ph_link).phn_next = (extent_t *)0x0;
            eVar8.ph_root = peVar7;
            if (peVar11 != (extent_t *)0x0) {
              uVar13 = peVar7->e_bits >> 0x2a;
              uVar12 = peVar11->e_bits >> 0x2a;
              iVar10 = (uint)(uVar12 < uVar13) - (uint)(uVar13 < uVar12);
              if (iVar10 == 0) {
                pvVar2 = peVar7->e_addr;
                pvVar3 = peVar11->e_addr;
                iVar10 = (uint)(pvVar2 >= pvVar3 && pvVar2 != pvVar3) - (uint)(pvVar2 < pvVar3);
              }
              if (iVar10 < 0) {
                (peVar11->ph_link).phn_prev = peVar7;
                peVar5 = (peVar7->ph_link).phn_lchild;
                (peVar11->ph_link).phn_next = peVar5;
                if (peVar5 != (extent_t *)0x0) {
                  (peVar5->ph_link).phn_prev = peVar11;
                }
                (peVar7->ph_link).phn_lchild = peVar11;
              }
              else {
                (peVar7->ph_link).phn_prev = peVar11;
                peVar5 = (peVar11->ph_link).phn_lchild;
                (peVar7->ph_link).phn_next = peVar5;
                if (peVar5 != (extent_t *)0x0) {
                  (peVar5->ph_link).phn_prev = peVar7;
                }
                (peVar11->ph_link).phn_lchild = peVar7;
                eVar8.ph_root = peVar11;
              }
            }
            if (peVar4 == (extent_t *)0x0) break;
            (peVar9->ph_link).phn_next = eVar8.ph_root;
            peVar11 = (peVar4->ph_link).phn_next;
            peVar7 = peVar4;
            peVar9 = eVar8.ph_root;
          }
        }
      }
      uVar12 = peVar1->e_bits >> 0x2a;
      uVar13 = (eVar8.ph_root)->e_bits >> 0x2a;
      iVar10 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
      if (iVar10 == 0) {
        pvVar2 = peVar1->e_addr;
        pvVar3 = (eVar8.ph_root)->e_addr;
        iVar10 = (uint)(pvVar2 >= pvVar3 && pvVar2 != pvVar3) - (uint)(pvVar2 < pvVar3);
      }
      if (iVar10 < 0) {
        ((eVar8.ph_root)->ph_link).phn_prev = peVar1;
        peVar9 = (peVar1->ph_link).phn_lchild;
        ppeVar6 = &(peVar1->ph_link).phn_lchild;
        ((eVar8.ph_root)->ph_link).phn_next = peVar9;
        if (peVar9 != (extent_t *)0x0) {
          (peVar9->ph_link).phn_prev = eVar8.ph_root;
        }
      }
      else {
        (peVar1->ph_link).phn_prev = eVar8.ph_root;
        peVar9 = ((eVar8.ph_root)->ph_link).phn_lchild;
        (peVar1->ph_link).phn_next = peVar9;
        if (peVar9 != (extent_t *)0x0) {
          (peVar9->ph_link).phn_prev = peVar1;
        }
        ((eVar8.ph_root)->ph_link).phn_lchild = peVar1;
        ppeVar6 = &ph->ph_root;
      }
      *ppeVar6 = eVar8.ph_root;
    }
    return ph->ph_root;
  }
  return (extent_t *)0x0;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}